

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vswprint.c
# Opt level: O3

int vswprintf_s(char16_t_conflict *string,size_t sizeInWords,char16_t_conflict *format,
               __va_list_tag *ap)

{
  tSafeCRT_AssertFuncPtr p_Var1;
  int iVar2;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  size_t __n;
  __va_list_tag *in_R8;
  ulong uVar6;
  
  if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0 || format != (char16_t_conflict *)0x0) {
    if (format != (char16_t_conflict *)0x0) {
      if (sMBUSafeCRTAssertFunc != (tSafeCRT_AssertFuncPtr)0x0 &&
          (sizeInWords == 0 || string == (char16_t_conflict *)0x0)) {
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInWords > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x94);
      }
      if (sizeInWords == 0 || string == (char16_t_conflict *)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0x16;
        if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
          return -1;
        }
        (*sMBUSafeCRTAssertFunc)
                  ("\"string != NULL && sizeInWords > 0\"","SafeCRT assert failed",
                   "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                   ,0x94);
        return -1;
      }
      iVar2 = _vswprintf_helper((WOUTPUTFN)string,(char16_t_conflict *)sizeInWords,(size_t)format,
                                (char16_t_conflict *)ap,in_R8);
      if (-1 < iVar2) {
        if (sizeInWords == 0xffffffffffffffff) {
          return iVar2;
        }
        if (sizeInWords == 0x7fffffff) {
          return iVar2;
        }
        uVar4 = (ulong)(iVar2 + 1);
        uVar6 = sizeInWords - uVar4;
        if (sizeInWords < uVar4 || uVar6 == 0) {
          return iVar2;
        }
        __n = 0x10;
        if (uVar6 < 9) {
          __n = uVar6 * 2;
        }
        memset(string + uVar4,0xfd,__n);
        return iVar2;
      }
      *string = 0;
      if (((sizeInWords != 0xffffffffffffffff) && (sizeInWords != 1)) && (sizeInWords != 0x7fffffff)
         ) {
        iVar5 = 8;
        if (sizeInWords - 1 < 8) {
          iVar5 = (int)(sizeInWords - 1);
        }
        memset(string + 1,0xfd,(ulong)(uint)(iVar5 * 2));
      }
      if (iVar2 != -2) {
        return iVar2;
      }
      if (sMBUSafeCRTAssertFunc == (tSafeCRT_AssertFuncPtr)0x0) {
        piVar3 = __errno_location();
        *piVar3 = 0x22;
        return -1;
      }
      (*sMBUSafeCRTAssertFunc)
                ("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                 ,0x9e);
      p_Var1 = sMBUSafeCRTAssertFunc;
      piVar3 = __errno_location();
      *piVar3 = 0x22;
      if (p_Var1 == (tSafeCRT_AssertFuncPtr)0x0) {
        return -1;
      }
      (*p_Var1)("\"(\\\"Buffer too small\\\" && 0)\"","SafeCRT assert failed",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
                ,0x9e);
      return -1;
    }
  }
  else {
    (*sMBUSafeCRTAssertFunc)
              ("\"format != NULL\"","SafeCRT assert failed",
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
               ,0x93);
  }
  p_Var1 = sMBUSafeCRTAssertFunc;
  piVar3 = __errno_location();
  *piVar3 = 0x16;
  if (p_Var1 != (tSafeCRT_AssertFuncPtr)0x0) {
    (*p_Var1)("\"format != NULL\"","SafeCRT assert failed",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/safecrt/vswprint.c"
              ,0x93);
  }
  return -1;
}

Assistant:

int __cdecl _vswprintf_s (
        char16_t *string,
        size_t sizeInWords,
        const char16_t *format,
        va_list ap
        )
{
    int retvalue = -1;

    /* validation section */
    _VALIDATE_RETURN(format != NULL, EINVAL, -1);
    _VALIDATE_RETURN(string != NULL && sizeInWords > 0, EINVAL, -1);

    retvalue = _vswprintf_helper(_woutput_s, string, sizeInWords, format, ap);
    if (retvalue < 0)
    {
        string[0] = 0;
        _SECURECRT__FILL_STRING(string, sizeInWords, 1);
    }
    if (retvalue == -2)
    {
        _VALIDATE_RETURN(("Buffer too small" && 0), ERANGE, -1);
    }
    if (retvalue >= 0)
    {
        _SECURECRT__FILL_STRING(string, sizeInWords, retvalue + 1);
    }

    return retvalue;
}